

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall
tetgenmesh::flip23(tetgenmesh *this,triface *fliptets,int hullflag,flipconstraints *fc)

{
  triface *newtet;
  uint uVar1;
  uint uVar2;
  memorypool *pmVar3;
  tetgenmesh *ptVar4;
  double *pdVar5;
  tetgenio *ptVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  tetgenmesh *p3;
  tetrahedron p0;
  tetgenmesh *p1;
  int i;
  long lVar10;
  tetrahedron *pppdVar11;
  tetrahedron ppdVar12;
  long lVar13;
  ulong *puVar14;
  tetrahedron *pppdVar15;
  int iVar16;
  int iVar17;
  tetrahedron *pppdVar18;
  ulong uVar19;
  int iVar20;
  int *piVar21;
  ulong uVar22;
  tetrahedron p0_00;
  ulong uVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  triface topcastets [3];
  triface botcastets [3];
  triface local_f8;
  tetrahedron local_e8;
  tetrahedron local_e0;
  int local_d4;
  tetgenmesh *local_d0;
  tetrahedron local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  tetgenmesh *local_a0;
  ulong uStack_98;
  uint local_90 [8];
  ulong uStack_70;
  ulong uStack_68;
  uint local_60 [12];
  
  lVar10 = 8;
  do {
    *(undefined8 *)((long)&local_a0 + lVar10) = 0;
    *(undefined4 *)((long)local_90 + lVar10 + -8) = 0;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x38);
  lVar10 = 8;
  do {
    *(undefined8 *)((long)&uStack_70 + lVar10) = 0;
    *(undefined4 *)((long)local_60 + lVar10 + -8) = 0;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x38);
  local_f8.tet = (tetrahedron *)0x0;
  local_f8.ver = 0;
  if (hullflag < 1) {
    pppdVar15 = fliptets->tet;
    iVar20 = fliptets->ver;
    pppdVar18 = fliptets[1].tet;
    iVar16 = fliptets[1].ver;
LAB_0011c2c7:
    bVar9 = false;
LAB_0011c2cf:
    bVar7 = false;
    bVar8 = false;
    pppdVar11 = pppdVar15;
    pppdVar15 = pppdVar18;
    iVar17 = iVar16;
    iVar16 = iVar20;
  }
  else {
    pppdVar15 = fliptets->tet;
    pppdVar18 = fliptets[1].tet;
    iVar16 = fliptets[1].ver;
    ppdVar12 = (tetrahedron)this->dummypoint;
    if (pppdVar18[oppopivot[iVar16]] == ppdVar12) {
      iVar17 = fliptets->ver;
      fliptets->tet = pppdVar18;
      fliptets->ver = iVar16;
      fliptets[1].tet = pppdVar15;
      fliptets[1].ver = iVar17;
      bVar9 = true;
      bVar8 = false;
      bVar7 = true;
      pppdVar11 = pppdVar18;
      local_f8.tet = pppdVar15;
      local_f8.ver = iVar17;
    }
    else {
      iVar20 = fliptets->ver;
      if (pppdVar15[orgpivot[iVar20]] != ppdVar12) {
        if (pppdVar15[destpivot[iVar20]] != ppdVar12) goto LAB_0011c2c7;
        iVar20 = eprevtbl[iVar20];
        fliptets->ver = iVar20;
        iVar16 = enexttbl[iVar16];
        fliptets[1].ver = iVar16;
        bVar9 = true;
        goto LAB_0011c2cf;
      }
      iVar20 = enexttbl[iVar20];
      fliptets->ver = iVar20;
      iVar17 = eprevtbl[iVar16];
      fliptets[1].ver = iVar17;
      bVar9 = true;
      bVar7 = false;
      bVar8 = true;
      pppdVar11 = pppdVar15;
      pppdVar15 = pppdVar18;
      iVar16 = iVar20;
    }
  }
  local_e0 = pppdVar11[orgpivot[iVar16]];
  local_e8 = pppdVar11[destpivot[iVar16]];
  local_d0 = (tetgenmesh *)pppdVar11[apexpivot[iVar16]];
  local_a0 = (tetgenmesh *)pppdVar11[oppopivot[iVar16]];
  local_c8 = pppdVar15[oppopivot[iVar17]];
  this->flip23count = this->flip23count + 1;
  lVar10 = 8;
  do {
    ppdVar12 = pppdVar11[facepivot1[iVar16]];
    *(ulong *)((long)&local_a0 + lVar10) = (ulong)ppdVar12 & 0xfffffffffffffff0;
    *(int *)((long)local_90 + lVar10 + -8) = facepivot2[iVar16][(uint)ppdVar12 & 0xf];
    iVar16 = enexttbl[iVar16];
    fliptets->ver = iVar16;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x38);
  lVar10 = 8;
  do {
    ppdVar12 = pppdVar15[facepivot1[iVar17]];
    *(ulong *)((long)&uStack_70 + lVar10) = (ulong)ppdVar12 & 0xfffffffffffffff0;
    *(int *)((long)local_60 + lVar10 + -8) = facepivot2[iVar17][(uint)ppdVar12 & 0xf];
    iVar17 = eprevtbl[iVar17];
    fliptets[1].ver = iVar17;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x38);
  fliptets->ver = 0xb;
  fliptets[1].ver = 0xb;
  *(undefined4 *)((long)pppdVar11 + (long)this->elemmarkerindex * 4) = 0;
  *(undefined4 *)((long)pppdVar15 + (long)this->elemmarkerindex * 4) = 0;
  if (this->checksubsegflag != 0) {
    ppdVar12 = pppdVar11[8];
    if (ppdVar12 != (tetrahedron)0x0) {
      pmVar3 = this->tet2segpool;
      *ppdVar12 = (double *)pmVar3->deaditemstack;
      pmVar3->deaditemstack = ppdVar12;
      pmVar3->items = pmVar3->items + -1;
      fliptets->tet[8] = (tetrahedron)0x0;
    }
    ppdVar12 = fliptets[1].tet[8];
    if (ppdVar12 != (tetrahedron)0x0) {
      pmVar3 = this->tet2segpool;
      *ppdVar12 = (double *)pmVar3->deaditemstack;
      pmVar3->deaditemstack = ppdVar12;
      pmVar3->items = pmVar3->items + -1;
      fliptets[1].tet[8] = (tetrahedron)0x0;
    }
  }
  if (this->checksubfaceflag != 0) {
    ppdVar12 = fliptets->tet[9];
    if (ppdVar12 != (tetrahedron)0x0) {
      pmVar3 = this->tet2subpool;
      *ppdVar12 = (double *)pmVar3->deaditemstack;
      pmVar3->deaditemstack = ppdVar12;
      pmVar3->items = pmVar3->items + -1;
      fliptets->tet[9] = (tetrahedron)0x0;
    }
    ppdVar12 = fliptets[1].tet[9];
    if (ppdVar12 != (tetrahedron)0x0) {
      pmVar3 = this->tet2subpool;
      *ppdVar12 = (double *)pmVar3->deaditemstack;
      pmVar3->deaditemstack = ppdVar12;
      pmVar3->items = pmVar3->items + -1;
      fliptets[1].tet[9] = (tetrahedron)0x0;
    }
  }
  newtet = fliptets + 2;
  local_d4 = hullflag;
  maketetrahedron(this,newtet);
  p1 = local_a0;
  p0 = local_c8;
  p3 = local_d0;
  ppdVar12 = local_e8;
  iVar20 = this->numelemattrib;
  if (0 < (long)iVar20) {
    iVar16 = this->elemattribindex;
    pppdVar15 = fliptets->tet;
    pppdVar18 = fliptets[2].tet;
    lVar10 = 0;
    do {
      pppdVar18[iVar16 + lVar10] = pppdVar15[iVar16 + lVar10];
      lVar10 = lVar10 + 1;
    } while (iVar20 != lVar10);
  }
  piVar21 = enexttbl;
  if (this->b->varvolume != 0) {
    fliptets[2].tet[this->volumeboundindex] = fliptets->tet[this->volumeboundindex];
  }
  if (local_d4 < 1) {
    iVar20 = fliptets->ver;
    fliptets->tet[orgpivot[iVar20]] = local_c8;
    fliptets->tet[destpivot[iVar20]] = (tetrahedron)local_a0;
    fliptets->tet[apexpivot[iVar20]] = local_e0;
    fliptets->tet[oppopivot[iVar20]] = local_e8;
    iVar20 = fliptets[1].ver;
    fliptets[1].tet[orgpivot[iVar20]] = local_c8;
    fliptets[1].tet[destpivot[iVar20]] = (tetrahedron)local_a0;
    fliptets[1].tet[apexpivot[iVar20]] = local_e8;
    fliptets[1].tet[oppopivot[iVar20]] = (tetrahedron)local_d0;
    iVar20 = fliptets[2].ver;
    fliptets[2].tet[orgpivot[iVar20]] = local_c8;
    fliptets[2].tet[destpivot[iVar20]] = (tetrahedron)local_a0;
    fliptets[2].tet[apexpivot[iVar20]] = (tetrahedron)local_d0;
    fliptets[2].tet[oppopivot[iVar20]] = local_e0;
    piVar21 = (int *)local_d0;
  }
  else {
    iVar20 = fliptets->ver;
    if (local_a0 == (tetgenmesh *)this->dummypoint) {
      fliptets->tet[orgpivot[iVar20]] = local_e0;
      fliptets->tet[destpivot[iVar20]] = local_e8;
      fliptets->tet[apexpivot[iVar20]] = local_c8;
      fliptets->tet[oppopivot[iVar20]] = (tetrahedron)local_a0;
      iVar20 = fliptets[1].ver;
      fliptets[1].tet[orgpivot[iVar20]] = local_e8;
      fliptets[1].tet[destpivot[iVar20]] = (tetrahedron)local_d0;
      fliptets[1].tet[apexpivot[iVar20]] = local_c8;
      fliptets[1].tet[oppopivot[iVar20]] = (tetrahedron)local_a0;
      iVar20 = fliptets[2].ver;
      fliptets[2].tet[orgpivot[iVar20]] = (tetrahedron)local_d0;
      fliptets[2].tet[destpivot[iVar20]] = local_e0;
      fliptets[2].tet[apexpivot[iVar20]] = local_c8;
      fliptets[2].tet[oppopivot[iVar20]] = (tetrahedron)local_a0;
      lVar10 = 8;
      do {
        iVar20 = eprevesymtbl[*(int *)((long)&fliptets->tet + lVar10)];
        *(int *)((long)&fliptets->tet + lVar10) = iVar20;
        *(int *)((long)&fliptets->tet + lVar10) = enexttbl[iVar20];
        lVar10 = lVar10 + 0x10;
      } while (lVar10 != 0x38);
      this->hullsize = this->hullsize + 2;
    }
    else {
      fliptets->tet[orgpivot[iVar20]] = local_c8;
      fliptets->tet[destpivot[iVar20]] = (tetrahedron)local_a0;
      fliptets->tet[apexpivot[iVar20]] = local_e0;
      fliptets->tet[oppopivot[iVar20]] = local_e8;
      iVar20 = fliptets[1].ver;
      fliptets[1].tet[orgpivot[iVar20]] = local_c8;
      fliptets[1].tet[destpivot[iVar20]] = (tetrahedron)local_a0;
      fliptets[1].tet[apexpivot[iVar20]] = local_e8;
      fliptets[1].tet[oppopivot[iVar20]] = (tetrahedron)local_d0;
      iVar20 = fliptets[2].ver;
      if (local_d0 == (tetgenmesh *)this->dummypoint) {
        fliptets[2].tet[orgpivot[iVar20]] = (tetrahedron)local_a0;
        fliptets[2].tet[destpivot[iVar20]] = local_c8;
        fliptets[2].tet[apexpivot[iVar20]] = local_e0;
        fliptets[2].tet[oppopivot[iVar20]] = (tetrahedron)local_d0;
        fliptets[2].ver = esymtbl[iVar20];
      }
      else {
        fliptets[2].tet[orgpivot[iVar20]] = local_c8;
        newtet->tet[destpivot[iVar20]] = (tetrahedron)local_a0;
        newtet->tet[apexpivot[iVar20]] = (tetrahedron)local_d0;
        newtet->tet[oppopivot[iVar20]] = local_e0;
      }
    }
  }
  if (fc->remove_ndelaunay_edge != 0) {
    ptVar4 = (tetgenmesh *)this->dummypoint;
    if (local_a0 == ptVar4) {
      local_c0 = 0.0;
      local_b8 = 0.0;
      local_b0 = 0.0;
      local_a8 = 0.0;
      p0_00 = local_e0;
LAB_0011c936:
      dVar25 = tetprismvol((tetgenmesh *)piVar21,(double *)ppdVar12,(double *)p0_00,(double *)p3,
                           (double *)p0);
      dVar24 = local_a8;
      dVar26 = local_b0;
      dVar27 = local_b8;
      dVar28 = local_c0;
    }
    else {
      dVar24 = tetprismvol((tetgenmesh *)piVar21,(double *)local_c8,(double *)local_a0,
                           (double *)local_e0,(double *)local_e8);
      if (p3 != ptVar4) {
        local_a8 = dVar24;
        local_b0 = tetprismvol((tetgenmesh *)piVar21,(double *)p0,(double *)p1,(double *)ppdVar12,
                               (double *)p3);
        p0_00 = local_e0;
        local_b8 = tetprismvol((tetgenmesh *)piVar21,(double *)p0,(double *)p1,(double *)p3,
                               (double *)local_e0);
        local_c0 = tetprismvol((tetgenmesh *)piVar21,(double *)p0_00,(double *)ppdVar12,(double *)p3
                               ,(double *)p1);
        goto LAB_0011c936;
      }
      dVar25 = 0.0;
      dVar28 = 0.0;
      dVar27 = 0.0;
      dVar26 = 0.0;
    }
    fc->tetprism_vol_sum = (((dVar26 + dVar24 + dVar27) - dVar28) - dVar25) + fc->tetprism_vol_sum;
  }
  piVar21 = &fliptets->ver;
  lVar10 = 1;
  do {
    pppdVar15 = ((triface *)(piVar21 + -2))->tet;
    uVar1 = esymtbl[*piVar21];
    lVar13 = lVar10;
    if (lVar10 == 3) {
      lVar13 = 0;
    }
    uVar2 = fliptets[lVar13].ver;
    pppdVar15[uVar1 & 3] =
         (tetrahedron)((long)bondtbl[(int)uVar1][(int)uVar2] | (ulong)fliptets[lVar13].tet);
    fliptets[lVar13].tet[uVar2 & 3] =
         (tetrahedron)((long)bondtbl[(int)uVar2][(int)uVar1] | (ulong)pppdVar15);
    piVar21 = piVar21 + 4;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  lVar10 = 8;
  do {
    local_f8.tet = *(tetrahedron **)((long)fliptets + lVar10 + -8);
    local_f8.ver = eorgoppotbl[*(int *)((long)&fliptets->tet + lVar10)];
    uVar23 = *(ulong *)((long)&local_a0 + lVar10);
    uVar1 = *(uint *)((long)local_90 + lVar10 + -8);
    local_f8.tet[local_f8.ver & 3] = (tetrahedron)((long)bondtbl[local_f8.ver][(int)uVar1] | uVar23)
    ;
    *(ulong *)(uVar23 + (ulong)(uVar1 & 3) * 8) =
         (long)bondtbl[(int)uVar1][local_f8.ver] | (ulong)local_f8.tet;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x38);
  lVar10 = 8;
  do {
    pppdVar15 = *(tetrahedron **)((long)fliptets + lVar10 + -8);
    uVar22 = (ulong)edestoppotbl[*(int *)((long)&fliptets->tet + lVar10)];
    uVar23 = *(ulong *)((long)&uStack_70 + lVar10);
    uVar1 = *(uint *)((long)local_60 + lVar10 + -8);
    pppdVar15[edestoppotbl[*(int *)((long)&fliptets->tet + lVar10)] & 3] =
         (tetrahedron)((long)bondtbl[uVar22][(int)uVar1] | uVar23);
    *(ulong *)(uVar23 + (ulong)(uVar1 & 3) * 8) =
         (long)bondtbl[(int)uVar1][uVar22] | (ulong)pppdVar15;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x38);
  if (this->checksubsegflag != 0) {
    lVar10 = 0;
    do {
      if ((*(long *)(*(long *)(local_90 + lVar10 * 4 + -2) + 0x40) != 0) &&
         (pdVar5 = *(double **)
                    (*(long *)(*(long *)(local_90 + lVar10 * 4 + -2) + 0x40) +
                    (long)ver2edge[(int)local_90[lVar10 * 4]] * 8), pdVar5 != (double *)0x0)) {
        pppdVar15 = fliptets[lVar10].tet;
        uVar1 = eorgoppotbl[fliptets[lVar10].ver];
        uVar22 = (ulong)uVar1;
        ppdVar12 = pppdVar15[8];
        if (ppdVar12 == (tetrahedron)0x0) {
          ppdVar12 = (tetrahedron)memorypool::alloc(this->tet2segpool);
          pppdVar15[8] = ppdVar12;
          lVar13 = 0;
          do {
            pppdVar15[8][lVar13] = (double *)0x0;
            lVar13 = lVar13 + 1;
          } while (lVar13 != 6);
          ppdVar12 = pppdVar15[8];
        }
        uVar23 = (ulong)pdVar5 & 0xfffffffffffffff8;
        ppdVar12[ver2edge[(int)uVar1]] = pdVar5;
        *(ulong *)(uVar23 + 0x48) = (long)(int)uVar1 | (ulong)pppdVar15;
        if ((fc->chkencflag & 1) != 0) {
          uVar1 = *(uint *)(uVar23 + 4 + (long)this->shmarkindex * 4);
          if ((uVar1 & 4) == 0) {
            pmVar3 = this->badsubsegs;
            *(uint *)(uVar23 + 4 + (long)this->shmarkindex * 4) = uVar1 | 4;
            puVar14 = (ulong *)memorypool::alloc(pmVar3);
            *puVar14 = uVar23;
            *(uint *)(puVar14 + 1) = (uint)pdVar5 & 7;
          }
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    local_f8.ver = (int)uVar22;
    lVar10 = 0;
    do {
      if ((*(long *)(*(long *)(local_90 + lVar10 * 4 + -2) + 0x40) != 0) &&
         (pdVar5 = *(double **)
                    (*(long *)(*(long *)(local_90 + lVar10 * 4 + -2) + 0x40) +
                    (long)ver2edge[eprevtbl[(int)local_90[lVar10 * 4]]] * 8),
         pdVar5 != (double *)0x0)) {
        pppdVar15 = fliptets[lVar10].tet;
        iVar20 = enexttbl[fliptets[lVar10].ver];
        ppdVar12 = pppdVar15[8];
        if (ppdVar12 == (tetrahedron)0x0) {
          ppdVar12 = (tetrahedron)memorypool::alloc(this->tet2segpool);
          pppdVar15[8] = ppdVar12;
          lVar13 = 0;
          do {
            pppdVar15[8][lVar13] = (double *)0x0;
            lVar13 = lVar13 + 1;
          } while (lVar13 != 6);
          ppdVar12 = pppdVar15[8];
        }
        uVar19 = (ulong)pdVar5 & 0xfffffffffffffff8;
        ppdVar12[ver2edge[iVar20]] = pdVar5;
        *(ulong *)(uVar19 + 0x48) = (ulong)pppdVar15 | (long)iVar20;
        uVar23 = (ulong)(((int)lVar10 + 2U) % 3 << 4);
        pppdVar15 = *(tetrahedron **)((long)&fliptets->tet + uVar23);
        uVar1 = eprevtbl[esymtbl[*(int *)((long)&fliptets->ver + uVar23)]];
        uVar22 = (ulong)uVar1;
        ppdVar12 = pppdVar15[8];
        if (ppdVar12 == (tetrahedron)0x0) {
          ppdVar12 = (tetrahedron)memorypool::alloc(this->tet2segpool);
          pppdVar15[8] = ppdVar12;
          lVar13 = 0;
          do {
            pppdVar15[8][lVar13] = (double *)0x0;
            lVar13 = lVar13 + 1;
          } while (lVar13 != 6);
          ppdVar12 = pppdVar15[8];
        }
        ppdVar12[ver2edge[(int)uVar1]] = pdVar5;
        *(ulong *)(uVar19 + 0x48) = (long)(int)uVar1 | (ulong)pppdVar15;
        if ((fc->chkencflag & 1) != 0) {
          uVar1 = *(uint *)(uVar19 + 4 + (long)this->shmarkindex * 4);
          if ((uVar1 & 4) == 0) {
            pmVar3 = this->badsubsegs;
            *(uint *)(uVar19 + 4 + (long)this->shmarkindex * 4) = uVar1 | 4;
            puVar14 = (ulong *)memorypool::alloc(pmVar3);
            *puVar14 = uVar19;
            *(uint *)(puVar14 + 1) = (uint)pdVar5 & 7;
          }
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    lVar10 = 0;
    local_f8.tet = pppdVar15;
    do {
      if ((*(long *)(*(long *)(local_60 + lVar10 * 4 + -2) + 0x40) != 0) &&
         (pdVar5 = *(double **)
                    (*(long *)(*(long *)(local_60 + lVar10 * 4 + -2) + 0x40) +
                    (long)ver2edge[enexttbl[(int)local_60[lVar10 * 4]]] * 8),
         pdVar5 != (double *)0x0)) {
        pppdVar15 = fliptets[lVar10].tet;
        iVar20 = eprevtbl[fliptets[lVar10].ver];
        ppdVar12 = pppdVar15[8];
        if (ppdVar12 == (tetrahedron)0x0) {
          ppdVar12 = (tetrahedron)memorypool::alloc(this->tet2segpool);
          pppdVar15[8] = ppdVar12;
          lVar13 = 0;
          do {
            pppdVar15[8][lVar13] = (double *)0x0;
            lVar13 = lVar13 + 1;
          } while (lVar13 != 6);
          ppdVar12 = pppdVar15[8];
        }
        uVar19 = (ulong)pdVar5 & 0xfffffffffffffff8;
        ppdVar12[ver2edge[iVar20]] = pdVar5;
        *(ulong *)(uVar19 + 0x48) = (ulong)pppdVar15 | (long)iVar20;
        uVar23 = (ulong)(((int)lVar10 + 2U) % 3 << 4);
        pppdVar15 = *(tetrahedron **)((long)&fliptets->tet + uVar23);
        uVar1 = enexttbl[esymtbl[*(int *)((long)&fliptets->ver + uVar23)]];
        uVar22 = (ulong)uVar1;
        ppdVar12 = pppdVar15[8];
        if (ppdVar12 == (tetrahedron)0x0) {
          ppdVar12 = (tetrahedron)memorypool::alloc(this->tet2segpool);
          pppdVar15[8] = ppdVar12;
          lVar13 = 0;
          do {
            pppdVar15[8][lVar13] = (double *)0x0;
            lVar13 = lVar13 + 1;
          } while (lVar13 != 6);
          ppdVar12 = pppdVar15[8];
        }
        ppdVar12[ver2edge[(int)uVar1]] = pdVar5;
        *(ulong *)(uVar19 + 0x48) = (long)(int)uVar1 | (ulong)pppdVar15;
        if ((fc->chkencflag & 1) != 0) {
          uVar1 = *(uint *)(uVar19 + 4 + (long)this->shmarkindex * 4);
          if ((uVar1 & 4) == 0) {
            pmVar3 = this->badsubsegs;
            *(uint *)(uVar19 + 4 + (long)this->shmarkindex * 4) = uVar1 | 4;
            puVar14 = (ulong *)memorypool::alloc(pmVar3);
            *puVar14 = uVar19;
            *(uint *)(puVar14 + 1) = (uint)pdVar5 & 7;
          }
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    local_f8.ver = (int)uVar22;
  }
  if (this->checksubfaceflag != 0) {
    lVar10 = 0;
    do {
      if (*(long *)(*(long *)(local_90 + lVar10 * 4 + -2) + 0x48) != 0) {
        uVar23 = *(ulong *)(*(long *)(*(long *)(local_90 + lVar10 * 4 + -2) + 0x48) +
                           (ulong)(local_90[lVar10 * 4] & 3) * 8);
        if (uVar23 != 0) {
          iVar20 = tspivottbl[(int)local_90[lVar10 * 4]][(uint)uVar23 & 7];
          pppdVar15 = fliptets[lVar10].tet;
          uVar1 = eorgoppotbl[fliptets[lVar10].ver];
          uVar22 = (ulong)uVar1;
          ppdVar12 = pppdVar15[9];
          if (ppdVar12 == (tetrahedron)0x0) {
            ppdVar12 = (tetrahedron)memorypool::alloc(this->tet2subpool);
            pppdVar15[9] = ppdVar12;
            lVar13 = 0;
            do {
              pppdVar15[9][lVar13] = (double *)0x0;
              lVar13 = lVar13 + 1;
            } while (lVar13 != 4);
            ppdVar12 = pppdVar15[9];
          }
          uVar23 = uVar23 & 0xfffffffffffffff8;
          uVar19 = (long)iVar20 ^ 1;
          ppdVar12[uVar1 & 3] = (double *)((long)tsbondtbl[(int)uVar1][uVar19] | uVar23);
          *(ulong *)(uVar23 + 0x48 + (ulong)((uint)uVar19 & 1) * 8) =
               (long)stbondtbl[(int)uVar1][uVar19] | (ulong)pppdVar15;
          if ((fc->chkencflag & 2) != 0) {
            uVar1 = *(uint *)(uVar23 + 4 + (long)this->shmarkindex * 4);
            if ((uVar1 & 4) == 0) {
              pmVar3 = this->badsubfacs;
              *(uint *)(uVar23 + 4 + (long)this->shmarkindex * 4) = uVar1 | 4;
              puVar14 = (ulong *)memorypool::alloc(pmVar3);
              *puVar14 = uVar23;
              *(uint *)(puVar14 + 1) = (uint)uVar19;
            }
          }
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    local_f8.ver = (int)uVar22;
    lVar10 = 0;
    local_f8.tet = pppdVar15;
    do {
      if (*(long *)(*(long *)(local_60 + lVar10 * 4 + -2) + 0x48) != 0) {
        uVar23 = *(ulong *)(*(long *)(*(long *)(local_60 + lVar10 * 4 + -2) + 0x48) +
                           (ulong)(local_60[lVar10 * 4] & 3) * 8);
        if (uVar23 != 0) {
          iVar20 = tspivottbl[(int)local_60[lVar10 * 4]][(uint)uVar23 & 7];
          pppdVar15 = fliptets[lVar10].tet;
          uVar1 = edestoppotbl[fliptets[lVar10].ver];
          ppdVar12 = pppdVar15[9];
          if (ppdVar12 == (tetrahedron)0x0) {
            ppdVar12 = (tetrahedron)memorypool::alloc(this->tet2subpool);
            pppdVar15[9] = ppdVar12;
            lVar13 = 0;
            do {
              pppdVar15[9][lVar13] = (double *)0x0;
              lVar13 = lVar13 + 1;
            } while (lVar13 != 4);
            ppdVar12 = pppdVar15[9];
          }
          uVar23 = uVar23 & 0xfffffffffffffff8;
          uVar22 = (long)iVar20 ^ 1;
          ppdVar12[uVar1 & 3] = (double *)((long)tsbondtbl[(int)uVar1][uVar22] | uVar23);
          *(ulong *)(uVar23 + 0x48 + (ulong)((uint)uVar22 & 1) * 8) =
               (long)stbondtbl[(int)uVar1][uVar22] | (ulong)pppdVar15;
          if ((fc->chkencflag & 2) != 0) {
            uVar1 = *(uint *)(uVar23 + 4 + (long)this->shmarkindex * 4);
            if ((uVar1 & 4) == 0) {
              pmVar3 = this->badsubfacs;
              *(uint *)(uVar23 + 4 + (long)this->shmarkindex * 4) = uVar1 | 4;
              puVar14 = (ulong *)memorypool::alloc(pmVar3);
              *puVar14 = uVar23;
              *(uint *)(puVar14 + 1) = (uint)uVar22;
            }
          }
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
  }
  if ((fc->chkencflag & 4) != 0) {
    lVar10 = 0;
    do {
      enqueuetetrahedron(this,(triface *)((long)&fliptets->tet + lVar10));
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x30);
  }
  pppdVar15 = fliptets->tet;
  iVar20 = this->point2simindex;
  local_e0[iVar20] = (double *)pppdVar15;
  local_e8[iVar20] = (double *)pppdVar15;
  (&local_d0->in)[iVar20] = (tetgenio *)fliptets[1].tet;
  ptVar6 = (tetgenio *)fliptets->tet;
  (&local_a0->in)[iVar20] = ptVar6;
  local_c8[iVar20] = (double *)ptVar6;
  if (bVar9 && 0 < local_d4) {
    if (bVar7) {
      lVar10 = 8;
      do {
        *(int *)((long)&fliptets->tet + lVar10) = esymtbl[*(int *)((long)&fliptets->tet + lVar10)];
        lVar10 = lVar10 + 0x10;
      } while (lVar10 != 0x38);
      pppdVar15 = fliptets[1].tet;
      iVar20 = fliptets[1].ver;
    }
    else {
      pppdVar15 = fliptets->tet;
      iVar20 = fliptets->ver;
      if (bVar8) {
        fliptets->tet = fliptets[2].tet;
        fliptets->ver = fliptets[2].ver;
        fliptets[2].tet = fliptets[1].tet;
        fliptets[2].ver = fliptets[1].ver;
        fliptets[1].tet = pppdVar15;
        fliptets[1].ver = iVar20;
        goto LAB_0011d2fe;
      }
      fliptets->tet = fliptets[1].tet;
      fliptets->ver = fliptets[1].ver;
    }
    fliptets[1].tet = fliptets[2].tet;
    fliptets[1].ver = fliptets[2].ver;
    fliptets[2].tet = pppdVar15;
    fliptets[2].ver = iVar20;
  }
LAB_0011d2fe:
  if (0 < fc->enqflag) {
    lVar10 = 8;
    do {
      local_f8.tet = *(tetrahedron **)((long)fliptets + lVar10 + -8);
      local_f8.ver = eprevesymtbl[*(int *)((long)&fliptets->tet + lVar10)];
      flippush(this,&this->flipstack,&local_f8);
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x38);
    if (1 < fc->enqflag) {
      lVar10 = 8;
      do {
        local_f8.tet = *(tetrahedron **)((long)fliptets + lVar10 + -8);
        local_f8.ver = enextesymtbl[*(int *)((long)&fliptets->tet + lVar10)];
        flippush(this,&this->flipstack,&local_f8);
        lVar10 = lVar10 + 0x10;
      } while (lVar10 != 0x38);
    }
  }
  (this->recenttet).tet = fliptets->tet;
  (this->recenttet).ver = fliptets->ver;
  return;
}

Assistant:

void tetgenmesh::flip23(triface* fliptets, int hullflag, flipconstraints *fc)
{
  triface topcastets[3], botcastets[3];
  triface newface, casface;
  point pa, pb, pc, pd, pe;
  REAL attrib, volume;
  int dummyflag = 0;  // range = {-1, 0, 1, 2}.
  int i;

  if (hullflag > 0) {
    // Check if e is dummypoint.
    if (oppo(fliptets[1]) == dummypoint) {
      // Swap the two old tets.
      newface = fliptets[0];
      fliptets[0] = fliptets[1];
      fliptets[1] = newface;
      dummyflag = -1;  // d is dummypoint.
    } else {
      // Check if either a or b is dummypoint.
      if (org(fliptets[0]) == dummypoint) {
        dummyflag = 1; // a is dummypoint.
        enextself(fliptets[0]);
        eprevself(fliptets[1]);
      } else if (dest(fliptets[0]) == dummypoint) {
        dummyflag = 2; // b is dummypoint.
        eprevself(fliptets[0]);
        enextself(fliptets[1]);
      } else {
        dummyflag = 0; // either c or d may be dummypoint.
      }
    }
  }

  pa =  org(fliptets[0]);
  pb = dest(fliptets[0]);
  pc = apex(fliptets[0]);
  pd = oppo(fliptets[0]);
  pe = oppo(fliptets[1]);

  flip23count++;

  // Get the outer boundary faces.
  for (i = 0; i < 3; i++) {
    fnext(fliptets[0], topcastets[i]);
    enextself(fliptets[0]);
  }
  for (i = 0; i < 3; i++) {
    fnext(fliptets[1], botcastets[i]);
    eprevself(fliptets[1]);
  }

  // Re-use fliptets[0] and fliptets[1].
  fliptets[0].ver = 11;
  fliptets[1].ver = 11;
  setelemmarker(fliptets[0].tet, 0); // Clear all flags.
  setelemmarker(fliptets[1].tet, 0);
  // NOTE: the element attributes and volume constraint remain unchanged.
  if (checksubsegflag) {
    // Dealloc the space to subsegments.
    if (fliptets[0].tet[8] != NULL) {
      tet2segpool->dealloc((shellface *) fliptets[0].tet[8]);
      fliptets[0].tet[8] = NULL;
    }
    if (fliptets[1].tet[8] != NULL) {
      tet2segpool->dealloc((shellface *) fliptets[1].tet[8]);
      fliptets[1].tet[8] = NULL;
    }
  }
  if (checksubfaceflag) {
    // Dealloc the space to subfaces.
    if (fliptets[0].tet[9] != NULL) {
      tet2subpool->dealloc((shellface *) fliptets[0].tet[9]);
      fliptets[0].tet[9] = NULL;
    }
    if (fliptets[1].tet[9] != NULL) {
      tet2subpool->dealloc((shellface *) fliptets[1].tet[9]);
      fliptets[1].tet[9] = NULL;
    }
  }
  // Create a new tet.
  maketetrahedron(&(fliptets[2]));
  // The new tet have the same attributes from the old tet.
  for (i = 0; i < numelemattrib; i++) {
    attrib = elemattribute(fliptets[0].tet, i);
    setelemattribute(fliptets[2].tet, i, attrib);
  }
  if (b->varvolume) {
    volume = volumebound(fliptets[0].tet);
    setvolumebound(fliptets[2].tet, volume);
  }

  if (hullflag > 0) {
    // Check if d is dummytet.
    if (pd != dummypoint) {
      setvertices(fliptets[0], pe, pd, pa, pb); // [e,d,a,b] *
      setvertices(fliptets[1], pe, pd, pb, pc); // [e,d,b,c] *
      // Check if c is dummypoint.
      if (pc != dummypoint) {
        setvertices(fliptets[2], pe, pd, pc, pa);  // [e,d,c,a] *
      } else {
        setvertices(fliptets[2], pd, pe, pa, pc); // [d,e,a,c]
        esymself(fliptets[2]);                    // [e,d,c,a] *
      }
      // The hullsize does not change.
    } else {
      // d is dummypoint.
      setvertices(fliptets[0], pa, pb, pe, pd); // [a,b,e,d]
      setvertices(fliptets[1], pb, pc, pe, pd); // [b,c,e,d]
      setvertices(fliptets[2], pc, pa, pe, pd); // [c,a,e,d]
      // Adjust the faces to [e,d,a,b], [e,d,b,c], [e,d,c,a] *
      for (i = 0; i < 3; i++) {
        eprevesymself(fliptets[i]);
        enextself(fliptets[i]);
      }
      // We deleted one hull tet, and created three hull tets.
      hullsize += 2;
    }
  } else {
    setvertices(fliptets[0], pe, pd, pa, pb); // [e,d,a,b] *
    setvertices(fliptets[1], pe, pd, pb, pc); // [e,d,b,c] *
    setvertices(fliptets[2], pe, pd, pc, pa); // [e,d,c,a] *
  }

  if (fc->remove_ndelaunay_edge) { // calc_tetprism_vol
    REAL volneg[2], volpos[3], vol_diff;
    if (pd != dummypoint) {
      if (pc != dummypoint) {
        volpos[0] = tetprismvol(pe, pd, pa, pb);
        volpos[1] = tetprismvol(pe, pd, pb, pc);
        volpos[2] = tetprismvol(pe, pd, pc, pa);
        volneg[0] = tetprismvol(pa, pb, pc, pd);
        volneg[1] = tetprismvol(pb, pa, pc, pe);
      } else { // pc == dummypoint
        volpos[0] = tetprismvol(pe, pd, pa, pb);
        volpos[1] = 0.;
        volpos[2] = 0.;
        volneg[0] = 0.;
        volneg[1] = 0.;
      }
    } else { // pd == dummypoint.
      volpos[0] = 0.;
      volpos[1] = 0.;
      volpos[2] = 0.;
      volneg[0] = 0.;
      volneg[1] = tetprismvol(pb, pa, pc, pe);
    }
    vol_diff = volpos[0] + volpos[1] + volpos[2] - volneg[0] - volneg[1];
    fc->tetprism_vol_sum  += vol_diff; // Update the total sum.
  }

  // Bond three new tets together.
  for (i = 0; i < 3; i++) {
    esym(fliptets[i], newface);
    bond(newface, fliptets[(i + 1) % 3]);
  }
  // Bond to top outer boundary faces (at [a,b,c,d]).
  for (i = 0; i < 3; i++) {
    eorgoppo(fliptets[i], newface); // At edges [b,a], [c,b], [a,c].
    bond(newface, topcastets[i]);
  }
  // Bond bottom outer boundary faces (at [b,a,c,e]).
  for (i = 0; i < 3; i++) {
    edestoppo(fliptets[i], newface); // At edges [a,b], [b,c], [c,a].
    bond(newface, botcastets[i]);
  }

  if (checksubsegflag) {
    // Bond subsegments if there are.
    // Each new tet has 5 edges to be checked (except the edge [e,d]). 
    face checkseg;
    // The middle three: [a,b], [b,c], [c,a].
    for (i = 0; i < 3; i++) {      
      if (issubseg(topcastets[i])) {
        tsspivot1(topcastets[i], checkseg);
        eorgoppo(fliptets[i], newface);
        tssbond1(newface, checkseg);
        sstbond1(checkseg, newface);
        if (fc->chkencflag & 1) {
          enqueuesubface(badsubsegs, &checkseg);
        }
      }
    }
    // The top three: [d,a], [d,b], [d,c]. Two tets per edge.
    for (i = 0; i < 3; i++) {
      eprev(topcastets[i], casface);      
      if (issubseg(casface)) {
        tsspivot1(casface, checkseg);
        enext(fliptets[i], newface);
        tssbond1(newface, checkseg);
        sstbond1(checkseg, newface);
        esym(fliptets[(i + 2) % 3], newface);
        eprevself(newface);
        tssbond1(newface, checkseg);
        sstbond1(checkseg, newface);
        if (fc->chkencflag & 1) {
          enqueuesubface(badsubsegs, &checkseg);
        }
      }
    }
    // The bot three: [a,e], [b,e], [c,e]. Two tets per edge.
    for (i = 0; i < 3; i++) {
      enext(botcastets[i], casface);
      if (issubseg(casface)) {
        tsspivot1(casface, checkseg);
        eprev(fliptets[i], newface);
        tssbond1(newface, checkseg);
        sstbond1(checkseg, newface);
        esym(fliptets[(i + 2) % 3], newface);
        enextself(newface);
        tssbond1(newface, checkseg);
        sstbond1(checkseg, newface);
        if (fc->chkencflag & 1) {
          enqueuesubface(badsubsegs, &checkseg);
        }
      }
    }
  } // if (checksubsegflag)

  if (checksubfaceflag) {
    // Bond 6 subfaces if there are.
    face checksh;
    for (i = 0; i < 3; i++) {      
      if (issubface(topcastets[i])) {
        tspivot(topcastets[i], checksh);
        eorgoppo(fliptets[i], newface);
        sesymself(checksh);
        tsbond(newface, checksh);
        if (fc->chkencflag & 2) {
          enqueuesubface(badsubfacs, &checksh);
        }
      }
    }
    for (i = 0; i < 3; i++) {
      if (issubface(botcastets[i])) {
        tspivot(botcastets[i], checksh);
        edestoppo(fliptets[i], newface);
        sesymself(checksh);
        tsbond(newface, checksh);
        if (fc->chkencflag & 2) {
          enqueuesubface(badsubfacs, &checksh);
        }
      }
    }
  } // if (checksubfaceflag)

  if (fc->chkencflag & 4) {
    // Put three new tets into check list.
    for (i = 0; i < 3; i++) {
      enqueuetetrahedron(&(fliptets[i]));
    }
  }

  // Update the point-to-tet map.
  setpoint2tet(pa, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pb, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pc, (tetrahedron) fliptets[1].tet);
  setpoint2tet(pd, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pe, (tetrahedron) fliptets[0].tet);

  if (hullflag > 0) {
    if (dummyflag != 0) {
      // Restore the original position of the points (for flipnm()).
      if (dummyflag == -1) { 
        // Reverse the edge.
        for (i = 0; i < 3; i++) {
          esymself(fliptets[i]);
        }
        // Swap the last two new tets.
        newface = fliptets[1];
        fliptets[1] = fliptets[2];
        fliptets[2] = newface;
      } else {
        // either a or b were swapped.
        if (dummyflag == 1) {
          // a is dummypoint.
          newface = fliptets[0];
          fliptets[0] = fliptets[2];
          fliptets[2] = fliptets[1];
          fliptets[1] = newface;
        } else { // dummyflag == 2
          // b is dummypoint.
          newface = fliptets[0];
          fliptets[0] = fliptets[1];
          fliptets[1] = fliptets[2];
          fliptets[2] = newface;
        }
      }
    }
  }

  if (fc->enqflag > 0) {
    // Queue faces which may be locally non-Delaunay.  
    for (i = 0; i < 3; i++) {
      eprevesym(fliptets[i], newface);
      flippush(flipstack, &newface);
    }
    if (fc->enqflag > 1) {
      for (i = 0; i < 3; i++) {
        enextesym(fliptets[i], newface);
        flippush(flipstack, &newface);
      }
    }
  }

  recenttet = fliptets[0];
}